

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_write.c
# Opt level: O0

int TIFFAppendToStrip(TIFF *tif,uint32_t strip,uint8_t *data,tmsize_t cc)

{
  uint64_t *puVar1;
  int iVar2;
  toff_t tVar3;
  ulong uVar4;
  void *p;
  void *pvVar5;
  tmsize_t tVar6;
  void *local_70;
  uint64_t toCopy;
  uint64_t offsetWrite;
  uint64_t offsetRead;
  void *temp;
  tmsize_t tempSize;
  int64_t old_byte_count;
  uint64_t m;
  TIFFDirectory *td;
  tmsize_t cc_local;
  uint8_t *data_local;
  uint32_t strip_local;
  TIFF *tif_local;
  
  tempSize = -1;
  if (tif->tif_curoff == 0) {
    tif->tif_lastvalidoff = 0;
  }
  if (((tif->tif_dir).td_stripoffset_p[strip] == 0) || (tif->tif_curoff == 0)) {
    if ((tif->tif_dir).td_nstrips == 0) {
      __assert_fail("td->td_nstrips > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_write.c"
                    ,0x304,"int TIFFAppendToStrip(TIFF *, uint32_t, uint8_t *, tmsize_t)");
    }
    if ((((tif->tif_dir).td_stripbytecount_p[strip] == 0) ||
        ((tif->tif_dir).td_stripoffset_p[strip] == 0)) ||
       ((tif->tif_dir).td_stripbytecount_p[strip] < (ulong)cc)) {
      tVar3 = (*tif->tif_seekproc)(tif->tif_clientdata,0,2);
      (tif->tif_dir).td_stripoffset_p[strip] = tVar3;
      tif->tif_flags = tif->tif_flags | 0x200000;
    }
    else {
      iVar2 = _TIFFSeekOK(tif,(tif->tif_dir).td_stripoffset_p[strip]);
      if (iVar2 == 0) {
        TIFFErrorExtR(tif,"TIFFAppendToStrip","Seek error at scanline %lu",(ulong)tif->tif_row);
        return 0;
      }
      tif->tif_lastvalidoff =
           (tif->tif_dir).td_stripoffset_p[strip] + (tif->tif_dir).td_stripbytecount_p[strip];
    }
    tif->tif_curoff = (tif->tif_dir).td_stripoffset_p[strip];
    tempSize = (tif->tif_dir).td_stripbytecount_p[strip];
    (tif->tif_dir).td_stripbytecount_p[strip] = 0;
  }
  old_byte_count = tif->tif_curoff + cc;
  if ((tif->tif_flags & 0x80000) == 0) {
    old_byte_count = old_byte_count & 0xffffffff;
  }
  if (((ulong)old_byte_count < tif->tif_curoff) || ((ulong)old_byte_count < (ulong)cc)) {
    TIFFErrorExtR(tif,"TIFFAppendToStrip","Maximum TIFF file size exceeded");
    return 0;
  }
  if (((tif->tif_lastvalidoff != 0) && (tif->tif_lastvalidoff < (ulong)old_byte_count)) &&
     ((tif->tif_dir).td_stripbytecount_p[strip] != 0)) {
    local_70 = (void *)(tif->tif_dir).td_stripbytecount_p[strip];
    temp = local_70;
    if ((void *)0xfffff < local_70) {
      temp = &std::__cxx11::_List_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_clear;
    }
    offsetWrite = (tif->tif_dir).td_stripoffset_p[strip];
    toCopy = (*tif->tif_seekproc)(tif->tif_clientdata,0,2);
    uVar4 = (long)local_70 + cc + toCopy;
    if (((tif->tif_flags & 0x80000) == 0) && (uVar4 != (uVar4 & 0xffffffff))) {
      TIFFErrorExtR(tif,"TIFFAppendToStrip","Maximum TIFF file size exceeded");
      return 0;
    }
    p = _TIFFmallocExt(tif,(tmsize_t)temp);
    if (p == (void *)0x0) {
      TIFFErrorExtR(tif,"TIFFAppendToStrip","No space for output buffer");
      return 0;
    }
    tif->tif_flags = tif->tif_flags | 0x200000;
    (tif->tif_dir).td_stripoffset_p[strip] = toCopy;
    (tif->tif_dir).td_stripbytecount_p[strip] = 0;
    for (; local_70 != (void *)0x0; local_70 = (void *)((long)local_70 - (long)temp)) {
      iVar2 = _TIFFSeekOK(tif,offsetWrite);
      if (iVar2 == 0) {
        TIFFErrorExtR(tif,"TIFFAppendToStrip","Seek error");
        _TIFFfreeExt(tif,p);
        return 0;
      }
      pvVar5 = (void *)(*tif->tif_readproc)(tif->tif_clientdata,p,(tmsize_t)temp);
      if (pvVar5 != temp) {
        TIFFErrorExtR(tif,"TIFFAppendToStrip","Cannot read");
        _TIFFfreeExt(tif,p);
        return 0;
      }
      iVar2 = _TIFFSeekOK(tif,toCopy);
      if (iVar2 == 0) {
        TIFFErrorExtR(tif,"TIFFAppendToStrip","Seek error");
        _TIFFfreeExt(tif,p);
        return 0;
      }
      pvVar5 = (void *)(*tif->tif_writeproc)(tif->tif_clientdata,p,(tmsize_t)temp);
      if (pvVar5 != temp) {
        TIFFErrorExtR(tif,"TIFFAppendToStrip","Cannot write");
        _TIFFfreeExt(tif,p);
        return 0;
      }
      offsetWrite = (long)temp + offsetWrite;
      toCopy = (long)temp + toCopy;
      puVar1 = (tif->tif_dir).td_stripbytecount_p;
      puVar1[strip] = (long)temp + puVar1[strip];
    }
    _TIFFfreeExt(tif,p);
    old_byte_count = cc + toCopy;
  }
  tVar6 = (*tif->tif_writeproc)(tif->tif_clientdata,data,cc);
  if (tVar6 == cc) {
    tif->tif_curoff = old_byte_count;
    puVar1 = (tif->tif_dir).td_stripbytecount_p;
    puVar1[strip] = cc + puVar1[strip];
    if ((tif->tif_dir).td_stripbytecount_p[strip] != tempSize) {
      tif->tif_flags = tif->tif_flags | 0x200000;
    }
    tif_local._4_4_ = 1;
  }
  else {
    TIFFErrorExtR(tif,"TIFFAppendToStrip","Write error at scanline %lu",(ulong)tif->tif_row);
    tif_local._4_4_ = 0;
  }
  return tif_local._4_4_;
}

Assistant:

static int TIFFAppendToStrip(TIFF *tif, uint32_t strip, uint8_t *data,
                             tmsize_t cc)
{
    static const char module[] = "TIFFAppendToStrip";
    TIFFDirectory *td = &tif->tif_dir;
    uint64_t m;
    int64_t old_byte_count = -1;

    if (tif->tif_curoff == 0)
        tif->tif_lastvalidoff = 0;

    if (td->td_stripoffset_p[strip] == 0 || tif->tif_curoff == 0)
    {
        assert(td->td_nstrips > 0);

        if (td->td_stripbytecount_p[strip] != 0 &&
            td->td_stripoffset_p[strip] != 0 &&
            td->td_stripbytecount_p[strip] >= (uint64_t)cc)
        {
            /*
             * There is already tile data on disk, and the new tile
             * data we have will fit in the same space.  The only
             * aspect of this that is risky is that there could be
             * more data to append to this strip before we are done
             * depending on how we are getting called.
             */
            if (!SeekOK(tif, td->td_stripoffset_p[strip]))
            {
                TIFFErrorExtR(tif, module, "Seek error at scanline %lu",
                              (unsigned long)tif->tif_row);
                return (0);
            }

            tif->tif_lastvalidoff =
                td->td_stripoffset_p[strip] + td->td_stripbytecount_p[strip];
        }
        else
        {
            /*
             * Seek to end of file, and set that as our location to
             * write this strip.
             */
            td->td_stripoffset_p[strip] = TIFFSeekFile(tif, 0, SEEK_END);
            tif->tif_flags |= TIFF_DIRTYSTRIP;
        }

        tif->tif_curoff = td->td_stripoffset_p[strip];

        /*
         * We are starting a fresh strip/tile, so set the size to zero.
         */
        old_byte_count = td->td_stripbytecount_p[strip];
        td->td_stripbytecount_p[strip] = 0;
    }

    m = tif->tif_curoff + cc;
    if (!(tif->tif_flags & TIFF_BIGTIFF))
        m = (uint32_t)m;
    if ((m < tif->tif_curoff) || (m < (uint64_t)cc))
    {
        TIFFErrorExtR(tif, module, "Maximum TIFF file size exceeded");
        return (0);
    }

    if (tif->tif_lastvalidoff != 0 && m > tif->tif_lastvalidoff &&
        td->td_stripbytecount_p[strip] > 0)
    {
        /* Ouch: we have detected that we are rewriting in place a strip/tile */
        /* with several calls to TIFFAppendToStrip(). The first call was with */
        /* a size smaller than the previous size of the strip/tile, so we */
        /* opted to rewrite in place, but a following call causes us to go */
        /* outsize of the strip/tile area, so we have to finally go for a */
        /* append-at-end-of-file strategy, and start by moving what we already
         */
        /* wrote. */
        tmsize_t tempSize;
        void *temp;
        uint64_t offsetRead;
        uint64_t offsetWrite;
        uint64_t toCopy = td->td_stripbytecount_p[strip];

        if (toCopy < 1024 * 1024)
            tempSize = (tmsize_t)toCopy;
        else
            tempSize = 1024 * 1024;

        offsetRead = td->td_stripoffset_p[strip];
        offsetWrite = TIFFSeekFile(tif, 0, SEEK_END);

        m = offsetWrite + toCopy + cc;
        if (!(tif->tif_flags & TIFF_BIGTIFF) && m != (uint32_t)m)
        {
            TIFFErrorExtR(tif, module, "Maximum TIFF file size exceeded");
            return (0);
        }

        temp = _TIFFmallocExt(tif, tempSize);
        if (temp == NULL)
        {
            TIFFErrorExtR(tif, module, "No space for output buffer");
            return (0);
        }

        tif->tif_flags |= TIFF_DIRTYSTRIP;

        td->td_stripoffset_p[strip] = offsetWrite;
        td->td_stripbytecount_p[strip] = 0;

        /* Move data written by previous calls to us at end of file */
        while (toCopy > 0)
        {
            if (!SeekOK(tif, offsetRead))
            {
                TIFFErrorExtR(tif, module, "Seek error");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!ReadOK(tif, temp, tempSize))
            {
                TIFFErrorExtR(tif, module, "Cannot read");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!SeekOK(tif, offsetWrite))
            {
                TIFFErrorExtR(tif, module, "Seek error");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            if (!WriteOK(tif, temp, tempSize))
            {
                TIFFErrorExtR(tif, module, "Cannot write");
                _TIFFfreeExt(tif, temp);
                return (0);
            }
            offsetRead += tempSize;
            offsetWrite += tempSize;
            td->td_stripbytecount_p[strip] += tempSize;
            toCopy -= tempSize;
        }
        _TIFFfreeExt(tif, temp);

        /* Append the data of this call */
        offsetWrite += cc;
        m = offsetWrite;
    }

    if (!WriteOK(tif, data, cc))
    {
        TIFFErrorExtR(tif, module, "Write error at scanline %lu",
                      (unsigned long)tif->tif_row);
        return (0);
    }
    tif->tif_curoff = m;
    td->td_stripbytecount_p[strip] += cc;

    if ((int64_t)td->td_stripbytecount_p[strip] != old_byte_count)
        tif->tif_flags |= TIFF_DIRTYSTRIP;

    return (1);
}